

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O1

void TasOptimization::makeNesterovTestFunction
               (double L,int k,ObjectiveFunctionSingle *func,GradientFunctionSingle *grad,
               vector<double,_std::allocator<double>_> *minimum)

{
  ulong uVar1;
  pointer __s;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  double local_20;
  
  local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(func->super__Function_base)._M_functor;
  local_48._8_4_ = *(undefined4 *)((long)&(func->super__Function_base)._M_functor + 8);
  local_48._12_4_ = *(undefined4 *)((long)&(func->super__Function_base)._M_functor + 0xc);
  *(double *)&(func->super__Function_base)._M_functor = L;
  *(int *)((long)&(func->super__Function_base)._M_functor + 8) = k;
  local_38 = (func->super__Function_base)._M_manager;
  (func->super__Function_base)._M_manager =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:249:12)>
       ::_M_manager;
  p_Stack_30 = (_Invoker_type)func->_M_invoker;
  func->_M_invoker =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:249:12)>
       ::_M_invoke;
  local_20 = L;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(grad->super__Function_base)._M_functor;
  local_48._8_4_ = *(undefined4 *)((long)&(grad->super__Function_base)._M_functor + 8);
  local_48._12_4_ = *(undefined4 *)((long)&(grad->super__Function_base)._M_functor + 0xc);
  *(double *)&(grad->super__Function_base)._M_functor = local_20;
  *(int *)((long)&(grad->super__Function_base)._M_functor + 8) = k;
  local_38 = (grad->super__Function_base)._M_manager;
  (grad->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:258:12)>
       ::_M_manager;
  p_Stack_30 = grad->_M_invoker;
  grad->_M_invoker =
       std::
       _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:258:12)>
       ::_M_invoke;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  pdVar2 = (minimum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (minimum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __s = pdVar2 + k;
  if (__s != pdVar3) {
    memset(__s,0,((long)pdVar3 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  if (0 < k) {
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      pdVar2[uVar4] = 1.0 - (double)(uVar1 & 0xffffffff) / ((double)k + 1.0);
      uVar4 = uVar1;
    } while ((uint)k != uVar1);
  }
  return;
}

Assistant:

void makeNesterovTestFunction(const double L, const int k, ObjectiveFunctionSingle &func, GradientFunctionSingle &grad,
                              std::vector<double> &minimum) {
    func = [=](const std::vector<double> &x)->double {
        double result = (L / 4.0) * ((1.0 / 2.0) * (x[0] * x[0] + x[k-1] * x[k-1]) - x[0]);
        double delta;
        for (int i=0; i<k-1; i++) {
            delta = x[i] - x[i+1];
            result += (L / 8.0) * (delta * delta);
        }
        return result;
    };
    grad = [=](const std::vector<double> &x, std::vector<double> &gx)->void {
        std::fill(gx.begin(), gx.end(), 0);
        gx[0] = (L / 4.0) * (x[0] - 1.0);
        gx[k-1] = (L / 4.0) * x[k-1];
        for (int i=0; i<k-1; i++) {
            gx[i] += (L / 4.0) * (x[i] - x[i+1]);
            gx[i+1] -= (L / 4.0) * (x[i] - x[i+1]);
        }
    };
    std::fill(minimum.begin() + k, minimum.end(), 0);
    for (int i=0; i<k; i++) {
        minimum[i] = 1.0 - ((double) i + 1.0) / (k + 1.0);
    }
}